

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamProgramChain.cpp
# Opt level: O0

string * __thiscall BamTools::SamProgramChain::NextIdFor(SamProgramChain *this,string *programId)

{
  bool bVar1;
  __type _Var2;
  reference pSVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  string *in_RDI;
  SamProgram *current;
  SamProgramConstIterator end;
  SamProgramConstIterator iter;
  string *__lhs;
  __normal_iterator<const_BamTools::SamProgram_*,_std::vector<BamTools::SamProgram,_std::allocator<BamTools::SamProgram>_>_>
  local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  __lhs = in_RDI;
  local_18 = in_RDX;
  local_20._M_current = (SamProgram *)ConstBegin((SamProgramChain *)in_RDI);
  ConstEnd((SamProgramChain *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_BamTools::SamProgram_*,_std::vector<BamTools::SamProgram,_std::allocator<BamTools::SamProgram>_>_>
                        *)__lhs,(__normal_iterator<const_BamTools::SamProgram_*,_std::vector<BamTools::SamProgram,_std::allocator<BamTools::SamProgram>_>_>
                                 *)in_RDI);
    if (!bVar1) {
      std::__cxx11::string::string((string *)in_RDI);
      return __lhs;
    }
    pSVar3 = __gnu_cxx::
             __normal_iterator<const_BamTools::SamProgram_*,_std::vector<BamTools::SamProgram,_std::allocator<BamTools::SamProgram>_>_>
             ::operator*(&local_20);
    bVar1 = SamProgram::HasPreviousProgramID((SamProgram *)0x1ed680);
    if ((!bVar1) && (_Var2 = std::operator==(&pSVar3->PreviousProgramID,local_18), _Var2)) break;
    __gnu_cxx::
    __normal_iterator<const_BamTools::SamProgram_*,_std::vector<BamTools::SamProgram,_std::allocator<BamTools::SamProgram>_>_>
    ::operator++(&local_20);
  }
  std::__cxx11::string::string((string *)in_RDI,(string *)&pSVar3->ID);
  return __lhs;
}

Assistant:

const std::string SamProgramChain::NextIdFor(const std::string& programId) const
{

    // find first record in container whose PreviousProgramID matches @programId
    SamProgramConstIterator iter = ConstBegin();
    SamProgramConstIterator end = ConstEnd();
    for (; iter != end; ++iter) {
        const SamProgram& current = (*iter);
        if (!current.HasPreviousProgramID() && current.PreviousProgramID == programId) {
            return current.ID;
        }
    }

    // none found
    return std::string();
}